

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *window,int n)

{
  ImU32 IVar1;
  bool local_19;
  int local_14;
  ImGuiID id;
  int n_local;
  ImGuiWindow *window_local;
  
  local_19 = 7 < (uint)n;
  local_14 = n;
  _id = window;
  if (local_19) {
    __assert_fail("n >= 0 && n <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1359,"ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *, int)");
  }
  IVar1 = ImHashStr("#RESIZE",0,window->ID);
  IVar1 = ImHashData(&local_14,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n <= 7);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}